

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ImmediatePromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>::destroy
          (ImmediatePromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *this)

{
  ImmediatePromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *this_local;
  
  freePromise<kj::_::ImmediatePromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>>>
            (this);
  return;
}

Assistant:

void destroy() override { freePromise(this); }